

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex.cc
# Opt level: O2

ostream * fizplex::operator<<(ostream *os,IterationDecision *id)

{
  int iVar1;
  mapped_type *pmVar2;
  long lVar3;
  undefined1 local_157;
  undefined1 local_156;
  undefined1 local_155;
  IterationDecision local_154 [7];
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_110;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::idtos_abi_cxx11_ == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)
                                 ::idtos_abi_cxx11_);
    if (iVar1 != 0) {
      local_154[6] = 0;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (&local_138,local_154 + 6,(char (*) [10])"Unbounded");
      local_154[5] = 1;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[10],_true>
                (&local_110,local_154 + 5,(char (*) [10])"BoundFlip");
      local_154[4] = 2;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_e8,local_154 + 4,(char (*) [11])"BaseChange");
      local_154[3] = 3;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[16],_true>
                (&local_c0,local_154 + 3,(char (*) [16])"OptimalSolution");
      local_154[2] = 4;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[17],_true>
                (&local_98,local_154 + 2,(char (*) [17])"SwitchToPhaseTwo");
      local_154[1] = 5;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_70,local_154 + 1,(char (*) [11])"Infeasible");
      local_154[0] = Unfinished;
      std::
      pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<fizplex::Simplex::IterationDecision,_const_char_(&)[11],_true>
                (&local_48,local_154,(char (*) [11])"Unfinished");
      std::
      _Hashtable<fizplex::Simplex::IterationDecision,std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::Simplex::IterationDecision>,std::hash<fizplex::Simplex::IterationDecision>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_Hashtable<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>const*>
                ((_Hashtable<fizplex::Simplex::IterationDecision,std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>,std::allocator<std::pair<fizplex::Simplex::IterationDecision_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<fizplex::Simplex::IterationDecision>,std::hash<fizplex::Simplex::IterationDecision>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                     idtos_abi_cxx11_,&local_138,&stack0xffffffffffffffe0,0,&local_155,&local_156,
                 &local_157);
      lVar3 = 0xf8;
      do {
        std::__cxx11::string::~string((string *)((long)&local_138.first + lVar3));
        lVar3 = lVar3 + -0x28;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   unordered_map<fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<fizplex::Simplex::IterationDecision>,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,
                   &operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                    idtos_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                           idtos_abi_cxx11_);
    }
  }
  pmVar2 = std::__detail::
           _Map_base<fizplex::Simplex::IterationDecision,_std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::hash<fizplex::Simplex::IterationDecision>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<fizplex::Simplex::IterationDecision,_std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_fizplex::Simplex::IterationDecision,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<fizplex::Simplex::IterationDecision>,_std::hash<fizplex::Simplex::IterationDecision>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&operator<<(std::ostream&,fizplex::Simplex::IterationDecision_const&)::
                            idtos_abi_cxx11_,id);
  std::operator<<(os,(string *)pmVar2);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os,
                         const Simplex::IterationDecision &id) {
  static std::unordered_map<Simplex::IterationDecision, std::string> idtos = {
      {Simplex::IterationDecision::Unbounded, "Unbounded"},
      {Simplex::IterationDecision::BoundFlip, "BoundFlip"},
      {Simplex::IterationDecision::BaseChange, "BaseChange"},
      {Simplex::IterationDecision::OptimalSolution, "OptimalSolution"},
      {Simplex::IterationDecision::SwitchToPhaseTwo, "SwitchToPhaseTwo"},
      {Simplex::IterationDecision::Infeasible, "Infeasible"},
      {Simplex::IterationDecision::Unfinished, "Unfinished"}};
  os << idtos[id];
  return os;
}